

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O2

REF_STATUS ref_fixture_twod_brick_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,REF_INT dim)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  undefined8 uVar9;
  int iVar10;
  char *pcVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  REF_INT cell;
  REF_INT edg [3];
  REF_INT node;
  REF_INT tri [4];
  REF_INT local_ac;
  ulong local_a8;
  ulong local_a0;
  uint local_94;
  uint local_90;
  undefined4 local_8c;
  REF_GRID_conflict local_88;
  double local_80;
  ulong local_78;
  REF_DBL local_70;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  undefined4 local_4c;
  ulong local_40;
  REF_NODE local_38;
  
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    pRVar1->twod = 1;
    if (pRVar1->mpi->id == 0) {
      uVar3 = dim - 1;
      local_80 = 1.0 / (double)(int)uVar3;
      local_78 = (ulong)dim;
      local_a0 = 0;
      uVar15 = 0;
      if (0 < dim) {
        uVar15 = (ulong)(uint)dim;
      }
      local_a8 = (ulong)(uint)dim;
      local_88 = pRVar1;
      for (uVar14 = 0; pRVar1 = local_88, uVar14 != uVar15; uVar14 = uVar14 + 1) {
        local_70 = (double)(int)uVar14 * local_80 + 0.0;
        for (uVar13 = 0; (uint)dim != uVar13; uVar13 = uVar13 + 1) {
          uVar4 = ref_node_add(ref_node,local_a0 + uVar13,&local_5c);
          if (uVar4 != 0) {
            uVar15 = (ulong)uVar4;
            pcVar11 = "node";
            uVar9 = 0x74f;
            goto LAB_00121805;
          }
          pRVar2 = ref_node->real;
          lVar8 = (long)local_5c;
          pRVar2[lVar8 * 0xf] = (double)(int)uVar13 * local_80 + 0.0;
          pRVar2[lVar8 * 0xf + 1] = local_70;
          pRVar2[lVar8 * 0xf + 2] = 0.0;
        }
        local_a0 = local_a0 + local_78;
      }
      local_8c = 1;
      local_a0 = 0;
      if (0 < (int)uVar3) {
        local_a0 = (ulong)uVar3;
      }
      uVar4 = 0;
      local_38 = ref_node;
      do {
        if ((uint)local_a0 == uVar4) {
          local_8c = 2;
          iVar10 = (uint)local_a0 + 1;
          uVar4 = (int)local_a8 * 2 - 1;
          uVar5 = uVar3;
          goto LAB_00121a2e;
        }
        local_94 = uVar4;
        local_90 = uVar4 + 1;
        uVar5 = ref_cell_add(pRVar1->cell[0],(REF_INT *)&local_94,&local_ac);
        uVar4 = uVar4 + 1;
      } while (uVar5 == 0);
      uVar15 = (ulong)uVar5;
      pcVar11 = "qua";
      uVar9 = 0x75b;
    }
    else {
      uVar3 = ref_node_initialize_n_global(ref_node,(ulong)(uint)(dim * dim));
      if (uVar3 == 0) {
        return 0;
      }
      uVar15 = (ulong)uVar3;
      pcVar11 = "init glob";
      uVar9 = 0x73d;
    }
  }
  else {
    uVar15 = (ulong)uVar3;
    pcVar11 = "create";
    uVar9 = 0x736;
  }
  goto LAB_00121805;
  while( true ) {
    local_94 = uVar5;
    local_90 = uVar4;
    uVar6 = ref_cell_add(local_88->cell[0],(REF_INT *)&local_94,&local_ac);
    uVar4 = uVar4 + iVar12;
    uVar5 = uVar5 + iVar12;
    if (uVar6 != 0) break;
LAB_00121a2e:
    iVar10 = iVar10 + -1;
    iVar12 = (int)local_a8;
    if (iVar10 == 0) {
      local_8c = 3;
      local_40 = (ulong)(uint)(iVar12 * iVar12);
      uVar4 = iVar12 * iVar12 - 1;
      iVar10 = iVar12 + -2;
      goto LAB_00121ab0;
    }
  }
  uVar15 = (ulong)uVar6;
  pcVar11 = "edg";
  uVar9 = 0x763;
  goto LAB_00121805;
  while( true ) {
    local_94 = uVar4;
    local_90 = uVar4 - 1;
    uVar5 = ref_cell_add(local_88->cell[0],(REF_INT *)&local_94,&local_ac);
    iVar10 = iVar10 + -1;
    uVar4 = uVar4 - 1;
    if (uVar5 != 0) break;
LAB_00121ab0:
    if (iVar10 < 0) {
      local_8c = 4;
      uVar4 = uVar3;
      uVar5 = (int)local_a8 * uVar3;
      uVar6 = (iVar12 + -2) * (int)local_a8;
      goto LAB_00121b28;
    }
  }
  uVar15 = (ulong)uVar5;
  pcVar11 = "edg";
  uVar9 = 0x76b;
  goto LAB_00121805;
  while( true ) {
    local_94 = uVar5;
    local_90 = uVar6;
    uVar7 = ref_cell_add(local_88->cell[0],(REF_INT *)&local_94,&local_ac);
    uVar5 = uVar5 - iVar10;
    uVar6 = uVar6 - iVar10;
    if (uVar7 != 0) break;
LAB_00121b28:
    pRVar1 = local_88;
    uVar4 = uVar4 - 1;
    iVar10 = (int)local_a8;
    if ((int)uVar4 < 0) {
      local_4c = 1;
      local_78 = (ulong)(iVar10 + 1);
      iVar10 = 0;
      iVar12 = 0;
      while (iVar12 != (uint)local_a0) {
        local_64 = iVar12 + 1;
        uVar4 = uVar3;
        local_60 = iVar10;
        while (uVar4 != 0) {
          local_80 = (double)CONCAT44(local_80._4_4_,uVar4 - 1);
          local_54 = iVar10 + 1;
          local_70 = (REF_DBL)CONCAT44(local_70._4_4_,local_54);
          iVar12 = (int)local_78 + iVar10;
          local_58 = iVar10;
          local_50 = iVar12;
          uVar4 = ref_cell_add(pRVar1->cell[3],&local_58,&local_ac);
          if (uVar4 != 0) {
            uVar15 = (ulong)uVar4;
            pcVar11 = "tri";
            uVar9 = 0x77d;
            goto LAB_00121805;
          }
          local_50 = iVar10 + (int)local_a8;
          local_58 = iVar10;
          local_54 = iVar12;
          uVar5 = ref_cell_add(pRVar1->cell[3],&local_58,&local_ac);
          uVar15 = (ulong)uVar5;
          uVar4 = local_80._0_4_;
          iVar10 = local_70._0_4_;
          if (uVar5 != 0) {
            pcVar11 = "tri";
            uVar9 = 0x781;
            goto LAB_00121805;
          }
        }
        iVar10 = local_60 + (int)local_a8;
        iVar12 = local_64;
      }
      uVar3 = ref_node_initialize_n_global(local_38,local_40);
      if (uVar3 == 0) {
        return 0;
      }
      uVar15 = (ulong)uVar3;
      pcVar11 = "init glob";
      uVar9 = 0x785;
      goto LAB_00121805;
    }
  }
  uVar15 = (ulong)uVar7;
  pcVar11 = "edg";
  uVar9 = 0x773;
LAB_00121805:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar9,
         "ref_fixture_twod_brick_grid",uVar15,pcVar11);
  return (REF_STATUS)uVar15;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_twod_brick_grid(REF_GRID *ref_grid_ptr,
                                               REF_MPI ref_mpi, REF_INT dim) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global, node, cell;
  REF_INT edg[3], tri[4];

  REF_INT m, n;
  REF_INT i, j;

  REF_DBL x0 = 0.0;
  REF_DBL x1 = 1.0;

  REF_DBL y0 = 0.0;
  REF_DBL y1 = 1.0;

  REF_DBL z = 0.0;

  REF_DBL dx, dy;

  m = dim;
  n = dim;

  dx = (x1 - x0) / ((REF_DBL)(n - 1));
  dy = (y1 - y0) / ((REF_DBL)(m - 1));

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  if (!ref_mpi_once(ref_grid_mpi(ref_grid))) {
    RSS(ref_node_initialize_n_global(ref_node, m * n), "init glob");
    return REF_SUCCESS;
  }

  /*
  y   3 --- 2
  ^   |     |
  |   |     |
  |   0 --- 1
  |
  +----> x
  */

#define ij2node(i, j, m, n) ((i) + (j) * (m))

  for (j = 0; j < n; j++) {
    for (i = 0; i < m; i++) {
      global = ij2node(i, j, m, n);
      RSS(ref_node_add(ref_node, global, &node), "node");
      ref_node_xyz(ref_node, 0, node) = x0 + dx * (REF_DBL)i;
      ref_node_xyz(ref_node, 1, node) = y0 + dy * (REF_DBL)j;
      ref_node_xyz(ref_node, 2, node) = z;
    }
  }

  edg[2] = 1;
  j = 0;
  for (i = 0; i < m - 1; i++) {
    edg[0] = ij2node(i, j, m, n);
    edg[1] = ij2node(i + 1, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "qua");
  }

  edg[2] = 2;
  i = m - 1;
  for (j = 0; j < n - 1; j++) {
    edg[0] = ij2node(i, j, m, n);
    edg[1] = ij2node(i, j + 1, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  edg[2] = 3;
  j = n - 1;
  for (i = m - 2; i >= 0; i--) {
    edg[0] = ij2node(i + 1, j, m, n);
    edg[1] = ij2node(i, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  edg[2] = 4;
  i = 0;
  for (j = n - 2; j >= 0; j--) {
    edg[0] = ij2node(i, j + 1, m, n);
    edg[1] = ij2node(i, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  tri[3] = 1;
  j = 1;
  for (j = 0; j < n - 1; j++) {
    for (i = 0; i < m - 1; i++) {
      tri[0] = ij2node(i, j, m, n);
      tri[1] = ij2node(i + 1, j, m, n);
      tri[2] = ij2node(i + 1, j + 1, m, n);
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
      tri[0] = ij2node(i, j, m, n);
      tri[1] = ij2node(i + 1, j + 1, m, n);
      tri[2] = ij2node(i, j + 1, m, n);
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
    }
  }

  RSS(ref_node_initialize_n_global(ref_node, m * n), "init glob");

  return REF_SUCCESS;
}